

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImTextStrToUtf8(char *buf,int buf_size,ImWchar *in_text,ImWchar *in_text_end)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  char *buf_out;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = (int)buf;
  pbVar1 = (byte *)(buf + (long)buf_size + -1);
  if (buf < pbVar1) {
    do {
      if ((in_text_end <= in_text && in_text_end != (ImWchar *)0x0) ||
         (uVar2 = *in_text, uVar2 == 0)) break;
      if (uVar2 < 0x80) {
        *buf = (byte)uVar2;
        buf = (char *)((byte *)buf + 1);
      }
      else {
        iVar4 = ~(uint)buf + buf_size + iVar3;
        if (uVar2 < 0x800) {
          if (1 < iVar4) {
            lVar6 = 1;
            *buf = (byte)(uVar2 >> 6) | 0xc0;
            lVar5 = 2;
            goto LAB_00224b16;
          }
LAB_00224ae3:
          lVar5 = 0;
        }
        else {
          if (iVar4 < 3) goto LAB_00224ae3;
          *buf = (byte)(uVar2 >> 0xc) | 0xe0;
          lVar6 = 2;
          ((byte *)buf)[1] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
          lVar5 = 3;
LAB_00224b16:
          ((byte *)buf)[lVar6] = (byte)uVar2 & 0x3f | 0x80;
        }
        buf = (char *)((byte *)buf + lVar5);
      }
      in_text = in_text + 1;
    } while (buf < pbVar1);
  }
  *buf = 0;
  return (int)buf - iVar3;
}

Assistant:

int ImTextStrToUtf8(char* buf, int buf_size, const ImWchar* in_text, const ImWchar* in_text_end)
{
    char* buf_out = buf;
    const char* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            *buf_out++ = (char)c;
        else
            buf_out += ImTextCharToUtf8(buf_out, (int)(buf_end-buf_out-1), c);
    }
    *buf_out = 0;
    return (int)(buf_out - buf);
}